

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O1

Vector<float> * __thiscall Vector<float>::operator=(Vector<float> *this,float *val)

{
  uint uVar1;
  float *pfVar2;
  long *plVar3;
  size_t sVar4;
  ulong uVar5;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  uVar1 = this->num_elts;
  if ((ulong)uVar1 == 0) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector","");
    plVar3 = local_38;
    if (local_30 != 0) {
      if (local_38 == (long *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
      }
      else {
        sVar4 = strlen((char *)local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)plVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else if (0 < (int)uVar1) {
    pfVar2 = this->ptr_to_data;
    uVar5 = 0;
    do {
      pfVar2[uVar5] = *val;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}